

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Count_Heap.h
# Opt level: O0

void __thiscall
Count_Heap<4U>::Count_Heap(Count_Heap<4U> *this,uint32_t _SIZE,uint32_t _length,uint32_t _hash_num)

{
  void *pvVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 *in_RDI;
  uint32_t in_stack_0000000c;
  Heap<4U> *in_stack_00000010;
  uint32_t i;
  Abstract<4U> *in_stack_ffffffffffffffc0;
  uint local_28;
  
  Abstract<4U>::Abstract(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR_Init_00124cb0;
  *(undefined4 *)(in_RDI + 0x10) = in_EDX;
  *(undefined4 *)((long)in_RDI + 0x84) = in_ECX;
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"Count_Heap");
  pvVar1 = operator_new(0x48);
  Heap<4U>::Heap(in_stack_00000010,in_stack_0000000c);
  in_RDI[0xe] = pvVar1;
  pvVar1 = operator_new__((ulong)*(uint *)((long)in_RDI + 0x84) << 3);
  in_RDI[0xf] = pvVar1;
  for (local_28 = 0; local_28 < *(uint *)((long)in_RDI + 0x84); local_28 = local_28 + 1) {
    pvVar1 = operator_new__((ulong)*(uint *)(in_RDI + 0x10) << 2);
    *(void **)(in_RDI[0xf] + (ulong)local_28 * 8) = pvVar1;
    memset(*(void **)(in_RDI[0xf] + (ulong)local_28 * 8),0,(ulong)*(uint *)(in_RDI + 0x10) << 2);
  }
  return;
}

Assistant:

Count_Heap(uint32_t _SIZE, uint32_t _length, uint32_t _hash_num)
		: length(_length), hash_num(_hash_num) {
		this->name = "Count_Heap";
		heap = new Heap<DATA_LEN>(_SIZE);
		counter = new int* [hash_num];
		for (uint32_t i = 0; i < hash_num; ++i) {
			counter[i] = new int[length];
			memset(counter[i], 0, sizeof(int) * length);
		}
	}